

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O1

BlockInfo * __thiscall
Wasm::WasmBytecodeGenerator::PushLabel
          (WasmBytecodeGenerator *this,WasmBlock blockData,ByteCodeLabel label,
          bool addBlockYieldInfo,bool checkInParams)

{
  ArenaAllocator *alloc;
  long *plVar1;
  WasmBlock this_00;
  bool bVar2;
  ArgSlot AVar3;
  OpCodeAsmJs OVar4;
  WasmType WVar5;
  EmitInfoBase EVar6;
  uint32 uVar7;
  Local LVar8;
  RegSlot RVar9;
  BlockInfo *this_01;
  WasmRegisterSpace *pWVar10;
  WasmSignature *this_02;
  undefined7 in_register_00000009;
  EmitInfo EVar11;
  EmitInfo EVar12;
  uint32 i;
  uint32 index;
  int iVar13;
  uint32 i_1;
  uint count;
  undefined1 local_70 [8];
  PolymorphicEmitInfo inParams;
  EmitInfo param;
  WasmBlock local_48;
  WasmBlock blockData_local;
  
  alloc = &this->m_alloc;
  local_48 = blockData;
  this_01 = (BlockInfo *)new<Memory::ArenaAllocator>(0x28,alloc,0x366bee);
  *(undefined8 *)&this_01->paramInfo = 0;
  (this_01->paramInfo).field_1.infos = (EmitInfo *)0x0;
  *(undefined8 *)&this_01->yieldInfo = 0;
  (this_01->yieldInfo).field_1.infos = (EmitInfo *)0x0;
  this_01->didYield = false;
  *(undefined3 *)&this_01->field_0x21 = 0;
  this_01->label = 0;
  this_01->label = label;
  if ((int)CONCAT71(in_register_00000009,addBlockYieldInfo) != 0) {
    if (local_48.isSingleResult == true) {
      WVar5 = WasmBlock::GetSingleResult(&local_48);
      if (WVar5 != Void) {
        WVar5 = WasmBlock::GetSingleResult(&local_48);
        pWVar10 = GetRegisterSpace(this,WVar5);
        EVar6.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar10);
        WVar5 = WasmBlock::GetSingleResult(&local_48);
        EVar11.type = WVar5;
        EVar11.super_EmitInfoBase.location = EVar6.location;
        PolymorphicEmitInfo::Init(&this_01->yieldInfo,EVar11);
      }
    }
    else {
      blockData_local = (WasmBlock)&this_01->yieldInfo;
      uVar7 = WasmBlock::GetSignatureId(&local_48);
      this_02 = Js::WebAssemblyModule::GetSignature(this->m_module,uVar7);
      AVar3 = WasmSignature::GetParamCount(this_02);
      bVar2 = AVar3 != 0 && checkInParams;
      local_70._0_4_ = 0;
      inParams.count = 0;
      inParams._4_4_ = 0;
      count = (uint)AVar3;
      if (bVar2) {
        PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)local_70,count,alloc);
        iVar13 = AVar3 + 1;
        do {
          LVar8 = WasmSignature::GetParam(this_02,(short)iVar13 - 2);
          inParams.field_1.singleInfo = PopEvalStack(this,LVar8,(char16 *)0x0);
          ReleaseLocation(this,&inParams.field_1.singleInfo);
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)local_70,inParams.field_1.singleInfo,
                     iVar13 - 2U & 0xffff);
          iVar13 = iVar13 + -1;
        } while (1 < iVar13);
      }
      uVar7 = this_02->m_resultsCount;
      if (uVar7 != 0) {
        PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)blockData_local,uVar7,alloc);
        index = 0;
        do {
          LVar8 = WasmSignature::GetResult(this_02,index);
          pWVar10 = GetRegisterSpace(this,LVar8);
          EVar6.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar10);
          EVar12.type = LVar8;
          EVar12.super_EmitInfoBase.location = EVar6.location;
          PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)blockData_local,EVar12,index);
          index = index + 1;
        } while (uVar7 != index);
      }
      blockData_local = (WasmBlock)this;
      if (bVar2) {
        PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)this_01,count,alloc);
        this_00 = blockData_local;
        uVar7 = 0;
        do {
          EVar12 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_70,uVar7);
          pWVar10 = GetRegisterSpace((WasmBytecodeGenerator *)this_00,EVar12.type);
          RVar9 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar10);
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)this_01,
                     (EmitInfo)((ulong)RVar9 | (ulong)EVar12 & 0xffffffff00000000),uVar7);
          uVar7 = uVar7 + 1;
        } while (count != uVar7);
        iVar13 = count + 1;
        do {
          EVar12 = PolymorphicEmitInfo::GetInfo
                             ((PolymorphicEmitInfo *)local_70,iVar13 - 2U & 0xffff);
          EVar11 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)this_01,iVar13 - 2U & 0xffff)
          ;
          plVar1 = *(long **)((long)blockData_local + 0xb8);
          OVar4 = GetLoadOp((WasmBytecodeGenerator *)blockData_local,EVar11.type);
          (**(code **)(*plVar1 + 0x78))
                    (plVar1,OVar4,(ulong)EVar11 & 0xffffffff,(ulong)EVar12 & 0xffffffff);
          iVar13 = iVar13 + -1;
          this = (WasmBytecodeGenerator *)blockData_local;
        } while (1 < iVar13);
      }
    }
  }
  JsUtil::
  List<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray((List<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)((long)this + 0x110),0);
  iVar13 = *(Type *)((long)this + 0x120);
  (*(Type *)((long)this + 0x118))[iVar13] = this_01;
  *(int *)((long)this + 0x120) = iVar13 + 1;
  return this_01;
}

Assistant:

BlockInfo* WasmBytecodeGenerator::PushLabel(WasmBlock blockData, Js::ByteCodeLabel label, bool addBlockYieldInfo, bool checkInParams)
{
    BlockInfo* blockInfo = Anew(&m_alloc, BlockInfo);
    blockInfo->label = label;
    if (addBlockYieldInfo)
    {
        if (blockData.IsSingleResult())
        {
            if (blockData.GetSingleResult() != WasmTypes::Void)
            {
                blockInfo->yieldInfo.Init(EmitInfo(GetRegisterSpace(blockData.GetSingleResult())->AcquireTmpRegister(), blockData.GetSingleResult()));
            }
        }
        else
        {
            uint32 sigId = blockData.GetSignatureId();
            WasmSignature* signature = m_module->GetSignature(sigId);

            Js::ArgSlot paramCount = signature->GetParamCount();
            checkInParams = checkInParams && paramCount > 0;
            PolymorphicEmitInfo inParams;
            if (checkInParams)
            {
                inParams.Init(paramCount, &m_alloc);
                // Pop the params in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo param = PopEvalStack(signature->GetParam(iArg));
                    ReleaseLocation(&param);
                    inParams.SetInfo(param, iArg);
                }
            }

            uint32 resultCount = signature->GetResultCount();
            if (resultCount > 0)
            {
                blockInfo->yieldInfo.Init(resultCount, &m_alloc);
                for (uint32 i = 0; i < resultCount; ++i)
                {
                    WasmTypes::WasmType type = signature->GetResult(i);
                    blockInfo->yieldInfo.SetInfo(EmitInfo(GetRegisterSpace(type)->AcquireTmpRegister(), type), i);
                }
            }

            if (checkInParams)
            {
                blockInfo->paramInfo.Init(paramCount, &m_alloc);
                // Acquire tmp registers in order
                for (uint32 i = 0; i < paramCount; ++i)
                {
                    EmitInfo info = inParams.GetInfo(i);
                    EmitInfo newInfo = info;
                    newInfo.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
                    blockInfo->paramInfo.SetInfo(newInfo, i);
                }
                // Todo:: Instead of moving inparams to new location,
                // Treat inparams as local and bypass ReleaseLocation until we exit the scope

                // Move in params to new location in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo info = inParams.GetInfo(iArg);
                    EmitInfo newInfo = blockInfo->paramInfo.GetInfo(iArg);
                    m_writer->AsmReg2(GetLoadOp(newInfo.type), newInfo.location, info.location);
                }
            }
        }
    }
    m_blockInfos.Push(blockInfo);
    return blockInfo;
}